

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteTest.h
# Opt level: O2

void __thiscall oout::SuiteTest::SuiteTest<>(SuiteTest *this,shared_ptr<const_oout::Test> *test1)

{
  initializer_list<std::shared_ptr<const_oout::Test>_> __l;
  allocator_type local_39;
  __shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2> local_38;
  _List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  local_28;
  
  std::__shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&test1->super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_38;
  std::__cxx11::
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::list
            ((list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
              *)&local_28,__l,&local_39);
  SuiteTest(this,(list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
                  *)&local_28);
  std::__cxx11::
  _List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  ::_M_clear(&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return;
}

Assistant:

explicit SuiteTest(
			const std::shared_ptr<const Test> &test1,
			const std::shared_ptr<T> & ... tests
		) : SuiteTest(std::list<std::shared_ptr<const Test>>{
			test1, tests...
		})
	{
	}